

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

void onmt::unicode::explode_utf8
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *chars,vector<int,_std::allocator<int>_> *code_points)

{
  string *in_RDX;
  anon_class_16_2_a35bce61 *in_RSI;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  anon_class_16_2_a35bce61 callback;
  
  std::__cxx11::string::length();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr,in_RDI);
  std::__cxx11::string::length();
  std::vector<int,_std::allocator<int>_>::reserve(unaff_retaddr,in_RDI);
  character_iterator<onmt::unicode::explode_utf8(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<int,std::allocator<int>>&)::__0>
            (in_RDX,in_RSI);
  return;
}

Assistant:

void explode_utf8(const std::string& str,
                      std::vector<std::string>& chars,
                      std::vector<code_point_t>& code_points)
    {
      chars.reserve(str.length());
      code_points.reserve(str.length());

      const auto callback = [&chars, &code_points](const char* data,
                                                   size_t length,
                                                   code_point_t code_point) {
        code_points.push_back(code_point);
        chars.emplace_back(data, length);
      };

      character_iterator(str, callback);
    }